

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O3

times * __thiscall lest::times::operator()(times *this,test *testing)

{
  pointer pcVar1;
  long lVar2;
  long lVar3;
  ostream *poVar4;
  undefined1 auVar5 [12];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  lVar2 = std::chrono::_V2::system_clock::now();
  pcVar1 = (testing->name)._M_dataplus._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + (testing->name)._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->output).ctx);
  std::__cxx11::string::_M_assign((string *)&(this->output).testing);
  if ((testing->behaviour).super__Function_base._M_manager == (_Manager_type)0x0) {
    auVar5 = std::__throw_bad_function_call();
    if (auVar5._8_4_ != 1) {
      _Unwind_Resume(auVar5._0_8_);
    }
    __cxa_begin_catch();
    this->failures = this->failures + 1;
    __cxa_end_catch();
  }
  else {
    (*(testing->behaviour)._M_invoker)((_Any_data *)&testing->behaviour,&this->output);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
  }
  poVar4 = (this->super_action).os;
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 3;
  lVar3 = std::chrono::_V2::system_clock::now();
  poVar4 = std::ostream::_M_insert<double>((double)((lVar3 - lVar2) / 1000) * 1e-06 * 1000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ms: ",5);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(testing->name)._M_dataplus._M_p,(testing->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  return this;
}

Assistant:

times & operator()( test testing )
    {
        timer t;

        try
        {
            testing.behaviour( output( testing.name ) );
        }
        catch( message const & )
        {
            ++failures;
        }

        os << std::setw(3) << ( 1000 * t.elapsed_seconds() ) << " ms: " << testing.name  << "\n";

        return *this;
    }